

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O1

void StatInit(SuperLUStat_t *stat)

{
  double dVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  double *pdVar6;
  flops_t *pfVar7;
  long lVar8;
  undefined1 *puVar9;
  double dVar10;
  char msg [256];
  undefined1 auStack_118 [264];
  
  puVar9 = auStack_118;
  iVar3 = sp_ienv(1);
  iVar4 = sp_ienv(2);
  if (iVar3 <= iVar4) {
    iVar3 = iVar4;
  }
  piVar5 = int32Calloc(iVar3 + 1);
  stat->panel_histo = piVar5;
  pdVar6 = (double *)superlu_malloc(0xb0);
  stat->utime = pdVar6;
  if (pdVar6 == (double *)0x0) {
    StatInit_cold_2();
  }
  else {
    pfVar7 = (flops_t *)superlu_malloc(0x58);
    stat->ops = pfVar7;
    if (pfVar7 != (flops_t *)0x0) {
      pdVar6 = stat->utime;
      lVar8 = 0;
      do {
        pdVar6[lVar8] = 0.0;
        pfVar7[lVar8] = 0.0;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0x16);
      stat->TinyPivots = 0;
      stat->RefineSteps = 0;
      stat->expansions = 0;
      return;
    }
  }
  StatInit_cold_1();
  lVar8 = *(long *)(puVar9 + 8);
  lVar2 = *(long *)(puVar9 + 0x10);
  printf("Factor time  = %8.5f\n",*(undefined8 *)(lVar8 + 0x38));
  dVar1 = *(double *)(lVar8 + 0x38);
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    dVar10 = (double)*(float *)(lVar2 + 0x1c);
    printf("Factor flops = %e\tMflops = %8.2f\n",dVar10,(dVar10 * 1e-06) / dVar1);
  }
  printf("Solve time   = %8.4f\n",*(undefined8 *)(lVar8 + 0x88));
  dVar1 = *(double *)(lVar8 + 0x88);
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    dVar10 = (double)*(float *)(lVar2 + 0x44);
    printf("Solve flops = %e\tMflops = %8.2f\n",dVar10,(dVar10 * 1e-06) / dVar1);
  }
  printf("Number of memory expansions: %d\n",(ulong)*(uint *)(puVar9 + 0x20));
  return;
}

Assistant:

void
StatInit(SuperLUStat_t *stat)
{
    register int i, w, panel_size, relax;

    panel_size = sp_ienv(1);
    relax = sp_ienv(2);
    w = SUPERLU_MAX(panel_size, relax);
    stat->panel_histo = int32Calloc(w+1);
    stat->utime = (double *) SUPERLU_MALLOC(NPHASES * sizeof(double));
    if (!stat->utime) ABORT("SUPERLU_MALLOC fails for stat->utime");
    stat->ops = (flops_t *) SUPERLU_MALLOC(NPHASES * sizeof(flops_t));
    if (!stat->ops) ABORT("SUPERLU_MALLOC fails for stat->ops");
    for (i = 0; i < NPHASES; ++i) {
        stat->utime[i] = 0.;
        stat->ops[i] = 0.;
    }
    stat->TinyPivots = 0;
    stat->RefineSteps = 0;
    stat->expansions = 0;
#if ( PRNTlevel >= 1 )
    printf(".. parameters in sp_ienv():\n");
    printf("\t 1: panel size \t %4d \n"
           "\t 2: relax      \t %4d \n"
           "\t 3: max. super \t %4d \n"
           "\t 4: row-dim 2D \t %4d \n"
           "\t 5: col-dim 2D \t %4d \n"
           "\t 6: fill ratio \t %4d \n",
	   sp_ienv(1), sp_ienv(2), sp_ienv(3), 
	   sp_ienv(4), sp_ienv(5), sp_ienv(6));
#endif
}